

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_fe.h
# Opt level: O0

void __thiscall
lf::uscalfe::LinearFELaplaceElementMatrix::LinearFELaplaceElementMatrix
          (LinearFELaplaceElementMatrix *this)

{
  double *y;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *pCVar1;
  Matrix<double,_2,_1,_0,_2,_1> *pMVar2;
  double *x;
  double dVar3;
  Scalar local_a8;
  Scalar local_a0;
  DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_98 [16];
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_88;
  Scalar local_58;
  Scalar local_50;
  DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_48 [24];
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_30;
  LinearFELaplaceElementMatrix *local_10;
  LinearFELaplaceElementMatrix *this_local;
  
  this->_vptr_LinearFELaplaceElementMatrix = (_func_int **)&PTR_isActive_00be3868;
  local_10 = this;
  dVar3 = sqrt(3.0);
  this->kSqrt3 = 1.0 / dVar3;
  x = &this->kZeta_0;
  this->kZeta_0 = this->kSqrt3 * -0.5 + 0.5;
  y = &this->kZeta_1;
  this->kZeta_1 = this->kSqrt3 * 0.5 + 0.5;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            ((Matrix<double,2,1,0,2,1> *)&this->kQuadPoints,x,x);
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            ((Matrix<double,2,1,0,2,1> *)((this->kQuadPoints)._M_elems + 1),x,y);
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            ((Matrix<double,2,1,0,2,1> *)((this->kQuadPoints)._M_elems + 2),y,x);
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            ((Matrix<double,2,1,0,2,1> *)((this->kQuadPoints)._M_elems + 3),y,y);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_48);
  local_50 = 0.3333333333333333;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<(&local_30,local_48,&local_50);
  local_58 = 0.3333333333333333;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                     (&local_30,&local_58);
  pMVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(pCVar1);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix(&this->kTriabc,pMVar2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_30);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_98);
  local_a0 = 0.7;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<(&local_88,local_98,&local_a0);
  local_a8 = 0.3;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                     (&local_88,&local_a8);
  pMVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(pCVar1);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix(&this->kQuadpt,pMVar2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_88);
  return;
}

Assistant:

LinearFELaplaceElementMatrix() = default;